

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Location.cpp
# Opt level: O3

string * Location::get_location(string *__return_storage_ptr__,string *ip_addr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  float fVar3;
  long *plVar4;
  reference pvVar5;
  undefined8 *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  Headers *pHVar8;
  _Base_ptr *pp_Var9;
  size_type *psVar10;
  _Base_ptr p_Var11;
  undefined8 uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  float ret;
  string continent;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  response;
  string rs;
  Result res;
  string address;
  string city;
  string region_name;
  string country;
  string zip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  key_type local_230;
  float local_20c;
  string local_208;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Base_ptr local_1b8;
  size_t local_1b0;
  double local_1a0;
  _Head_base<0UL,_httplib::ClientImpl_*,_false> local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  _Base_ptr *local_188;
  long local_180;
  _Base_ptr local_178;
  long lStack_170;
  undefined1 local_168 [40];
  long lStack_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 *local_118;
  undefined1 local_110 [40];
  undefined1 local_e8 [32];
  undefined1 local_c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  _Base_ptr local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  _Base_ptr p_Stack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Any_data local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  local_1d8._8_8_ = 0;
  local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
  paVar1 = &local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_allocated_capacity =
       local_208.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_208._M_dataplus._M_p = (pointer)paVar1;
  local_1d8._0_8_ = &local_1c8;
  httplib::Client::Client
            ((Client *)&local_198,"http://api.ipstack.com",(string *)local_1d8,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  std::operator+(&local_208,"/",ip_addr);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_208);
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar7) {
    local_1c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_1c8._8_8_ = plVar4[3];
    local_1d8._0_8_ = &local_1c8;
  }
  else {
    local_1c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_1d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar4;
  }
  local_1d8._8_8_ = plVar4[1];
  *plVar4 = (long)paVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append(local_1d8,ipStackAccessKey_abi_cxx11_);
  local_168._16_8_ = local_168 + 0x20;
  pHVar8 = (Headers *)(plVar4 + 2);
  if ((Headers *)*plVar4 == pHVar8) {
    local_168._32_8_ = *(undefined8 *)&(pHVar8->_M_t)._M_impl;
    lStack_140 = plVar4[3];
  }
  else {
    local_168._32_8_ = *(undefined8 *)&(pHVar8->_M_t)._M_impl;
    local_168._16_8_ = (Headers *)*plVar4;
  }
  local_168._24_8_ = plVar4[1];
  *plVar4 = (long)pHVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_1c8._8_8_ = local_1d8 + 8;
  local_1c8._M_allocated_capacity = 0;
  local_1d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_1d8._8_8_ = 0;
  local_1b0 = 0;
  local_208._M_dataplus._M_p = (pointer)0x0;
  local_208._M_string_length = 0;
  local_208.field_2._M_allocated_capacity = 0;
  local_208.field_2._8_8_ = 0;
  local_1b8 = (_Base_ptr)local_1c8._8_8_;
  httplib::ClientImpl::Get
            ((ClientImpl *)local_168,(char *)local_198._M_head_impl,(Headers *)local_168._16_8_,
             (Progress *)local_1d8);
  if ((code *)local_208.field_2._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_208.field_2._M_allocated_capacity)(&local_208,&local_208,3);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1d8);
  if ((Response *)local_168._0_8_ != (Response *)0x0) {
    if (*(int *)(local_168._0_8_ + 0x20) == 200) {
      pcVar2 = (((string *)(local_168._0_8_ + 0x78))->_M_dataplus)._M_p;
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d8,pcVar2,
                 pcVar2 + ((string *)(local_168._0_8_ + 0x78))->_M_string_length);
      local_58._M_unused._M_object = (pointer)0x0;
      local_58._8_8_ = 0;
      local_48._M_allocated_capacity = 0;
      local_48._8_8_ = 0;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::parse<std::__cxx11::string&>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 (parser_callback_t *)&local_58,true,false);
      if ((code *)local_48._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_48._M_allocated_capacity)(&local_58,&local_58,3);
      }
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity =
           local_208.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_e8._16_8_ = local_c8;
      local_e8._24_8_ = (__pthread_internal_list *)0x0;
      local_c8[0] = '\0';
      local_110._24_8_ = local_e8;
      local_110._32_8_ = (__pthread_internal_list *)0x0;
      local_e8[0] = '\0';
      local_118 = local_110 + 8;
      local_110._0_8_ = 0;
      local_110[8] = '\0';
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      paVar7 = &local_230.field_2;
      local_230._M_dataplus._M_p = (pointer)paVar7;
      local_208._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"continent_name","");
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_1e8,&local_230);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_250,pvVar5);
      std::__cxx11::string::operator=((string *)&local_208,(string *)&local_250);
      paVar1 = &local_250.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar7) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"country_name","");
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_1e8,&local_230);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_250,pvVar5);
      std::__cxx11::string::operator=((string *)(local_e8 + 0x10),(string *)&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar7) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"region_name","");
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_1e8,&local_230);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_250,pvVar5);
      std::__cxx11::string::operator=((string *)(local_110 + 0x18),(string *)&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar7) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"city","");
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_1e8,&local_230);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_250,pvVar5);
      std::__cxx11::string::operator=((string *)&local_118,(string *)&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar7) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"zip","");
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_1e8,&local_230);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_250,pvVar5);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar7) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      local_250._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"latitude","");
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_1e8,&local_250);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_float,_0>
                (pvVar5,&local_20c);
      fVar3 = local_20c;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_250._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"longitude","");
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_1e8,&local_250);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_float,_0>
                (pvVar5,&local_20c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        local_1a0 = (double)CONCAT44(local_1a0._4_4_,local_20c);
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        local_20c = local_1a0._0_4_;
      }
      local_1a0 = (double)local_20c;
      local_190 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_190;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      paVar1 = &local_250.field_2;
      local_250._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_118,local_118 + local_110._0_8_);
      std::__cxx11::string::append((char *)&local_250);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_250._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_250._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_110._24_8_,
                 (undefined1 *)
                 ((long)(__pthread_internal_list **)local_110._32_8_ + local_110._24_8_));
      std::__cxx11::string::append((char *)&local_250);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_250._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_250._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_e8._16_8_,
                 (undefined1 *)((long)(__pthread_internal_list **)local_e8._24_8_ + local_e8._16_8_)
                );
      std::__cxx11::string::append((char *)&local_250);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_250._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_250._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_208._M_dataplus._M_p,
                 local_208._M_dataplus._M_p + local_208._M_string_length);
      std::__cxx11::string::append((char *)&local_250);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_250._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_250,"Zip: ",&local_b8);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_250._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_78,vsnprintf,0x3a,"%f",SUB84((double)fVar3,0));
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x12eae0);
      p_Var11 = (_Base_ptr)(plVar4 + 2);
      if ((_Base_ptr)*plVar4 == p_Var11) {
        local_88 = *(_Base_ptr *)p_Var11;
        p_Stack_80 = (_Base_ptr)plVar4[3];
        local_98 = (_Base_ptr)&local_88;
      }
      else {
        local_88 = *(_Base_ptr *)p_Var11;
        local_98 = (_Base_ptr)*plVar4;
      }
      local_90 = (_Base_ptr)plVar4[1];
      *plVar4 = (long)p_Var11;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
      pp_Var9 = (_Base_ptr *)(plVar4 + 2);
      if ((_Base_ptr *)*plVar4 == pp_Var9) {
        local_178 = *pp_Var9;
        lStack_170 = plVar4[3];
        local_188 = &local_178;
      }
      else {
        local_178 = *pp_Var9;
        local_188 = (_Base_ptr *)*plVar4;
      }
      local_180 = plVar4[1];
      *plVar4 = (long)pp_Var9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_138,vsnprintf,0x3a,"%f",SUB84(local_1a0,0));
      p_Var11 = (_Base_ptr)0xf;
      if (local_188 != &local_178) {
        p_Var11 = local_178;
      }
      if (p_Var11 < (_Base_ptr)(local_138._M_string_length + local_180)) {
        uVar12 = (_Base_ptr)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          uVar12 = local_138.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < (_Base_ptr)(local_138._M_string_length + local_180)) goto LAB_00109c05;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_188);
      }
      else {
LAB_00109c05:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_188,(ulong)local_138._M_dataplus._M_p);
      }
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_230.field_2._M_allocated_capacity = *psVar10;
        local_230.field_2._8_8_ = puVar6[3];
        local_230._M_dataplus._M_p = (pointer)paVar7;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar10;
        local_230._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_230._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)psVar10 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_230);
      psVar10 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_250.field_2._M_allocated_capacity = *psVar10;
        local_250.field_2._8_8_ = plVar4[3];
        local_250._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_250.field_2._M_allocated_capacity = *psVar10;
        local_250._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_250._M_string_length = plVar4[1];
      *plVar4 = (long)psVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_250._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar1) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar7) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        (ulong)(local_138.field_2._M_allocated_capacity + 1));
      }
      if (local_188 != &local_178) {
        operator_delete(local_188,(ulong)((long)&local_178->_M_color + 1));
      }
      if (local_98 != (_Base_ptr)&local_88) {
        operator_delete(local_98,(ulong)((long)&local_88->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      if (local_118 != local_110 + 8) {
        operator_delete(local_118,CONCAT71(local_110._9_7_,local_110[8]) + 1);
      }
      if ((__pthread_internal_list *)local_110._24_8_ != (__pthread_internal_list *)local_e8) {
        operator_delete((void *)local_110._24_8_,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
      }
      if ((undefined1 *)local_e8._16_8_ != local_c8) {
        operator_delete((void *)local_e8._16_8_,CONCAT71(local_c8._1_7_,local_c8[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        (ulong)(local_208.field_2._M_allocated_capacity + 1));
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_1e8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::json_value::destroy((json_value *)(local_1e8 + 8),(value_t)local_1e8[0]);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
                ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)local_168
                );
      goto LAB_00109e72;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error Fetching IP, Status Code ",0x1f);
    plVar4 = (long *)std::ostream::operator<<(&std::cout,*(int *)(local_168._0_8_ + 0x20));
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)local_168);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"Cannot Determine Location","");
LAB_00109e72:
  if ((Headers *)local_168._16_8_ != (Headers *)(local_168 + 0x20)) {
    operator_delete((void *)local_168._16_8_,local_168._32_8_ + 1);
  }
  if (local_198._M_head_impl != (ClientImpl *)0x0) {
    (*(local_198._M_head_impl)->_vptr_ClientImpl[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Location::get_location(const std::string &ip_addr) {
	httplib::Client client("http://api.ipstack.com");
	std::string address = "/" + ip_addr + "?access_key=" + Location::ipStackAccessKey;

	if (auto res = client.Get(address.c_str())) {
		if (res->status == 200) {
			std::string rs = res->body;
			auto response = nlohmann::json::parse(rs);

			std::string continent, country, region_name, city, zip;
			float latitude, longitude;

			try {
				continent = response.at("continent_name");
				country = response.at("country_name");
				region_name = response.at("region_name");
				city = response.at("city");
				zip = response.at("zip");
				latitude = response.at("latitude");
				longitude = response.at("longitude");
			} catch (...) {
				// do nothing, let the particular string be empty
			}

			std::string result;
			result += "Location: ";
			result += city + ", ";
			result += region_name + ", ";
			result += country + ", ";
			result += continent + "\n";
			result += "Zip: " + zip;
			result += ", Coordinates: " + std::to_string(latitude) + "," + std::to_string(longitude) + "\n";

			return result;

		} else {
			std::cout << "Error Fetching IP, Status Code " << res->status << std::endl;
		}
	}

	return "Cannot Determine Location";
}